

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

void __thiscall VulkanHppGenerator::checkCommandCorrectness(VulkanHppGenerator *this)

{
  _Base_ptr *__lhs;
  int iVar1;
  _Rb_tree_color line;
  _Base_ptr p_Var2;
  bool bVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ec;
  byte bVar7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultCodes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  gatherResultCodes_abi_cxx11_
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_60,this);
  for (p_Var6 = (this->m_commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->m_commands)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    p_Var5 = p_Var6[7]._M_parent;
    iVar1 = *(int *)&p_Var6[9]._M_parent;
    std::operator+(&local_a0,"command <",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 1)
                  );
    std::operator+(&local_80,&local_a0,"> not required in any feature or extension");
    checkForError(p_Var5 != (_Base_ptr)0x0,iVar1,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    p_Var2 = p_Var6[3]._M_right;
    for (p_Var5 = p_Var6[3]._M_left; p_Var5 != p_Var2; p_Var5 = p_Var5 + 1) {
      bVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::contains((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_60,(key_type *)p_Var5);
      iVar1 = *(int *)&p_Var6[9]._M_parent;
      std::operator+(&local_a0,"command uses unknown error code <",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var5);
      std::operator+(&local_80,&local_a0,">");
      checkForError(bVar3,iVar1,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    p_Var2 = p_Var6[8]._M_right;
    for (p_Var5 = p_Var6[8]._M_left; p_Var5 != p_Var2; p_Var5 = p_Var5 + 1) {
      bVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::contains((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_60,(key_type *)p_Var5);
      iVar1 = *(int *)&p_Var6[9]._M_parent;
      std::operator+(&local_a0,"command uses unknown success code <",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var5);
      std::operator+(&local_80,&local_a0,">");
      checkForError(bVar3,iVar1,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    __lhs = &p_Var6[7]._M_left;
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,"VkResult");
    if ((bVar3) && (p_Var6[8]._M_left == p_Var6[8]._M_right)) {
      bVar7 = 0;
      for (p_Var5 = p_Var6[6]._M_right; p_Var5 != (_Base_ptr)&p_Var6[6]._M_parent;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        bVar3 = isSupportedFeature(this,(string *)(p_Var5 + 1));
        bVar4 = true;
        if (!bVar3) {
          bVar4 = isSupportedExtension(this,(string *)(p_Var5 + 1));
        }
        bVar7 = bVar7 | bVar4;
      }
      if (bVar7 != 0) {
        iVar1 = *(int *)&p_Var6[9]._M_parent;
        std::operator+(&local_a0,"missing successcodes on command <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var6 + 1));
        std::operator+(&local_80,&local_a0,"> returning VkResult!");
        checkForError(false,iVar1,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
      }
    }
    p_Var2 = p_Var6[5]._M_left;
    for (p_Var5 = p_Var6[5]._M_parent; p_Var5 != p_Var2; p_Var5 = (_Base_ptr)&p_Var5[8]._M_parent) {
      bVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
              ::contains(&this->m_types,(key_type *)(p_Var5 + 1));
      line = p_Var5[8]._M_color;
      std::operator+(&local_a0,"comand uses parameter of unknown type <",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var5 + 1));
      std::operator+(&local_80,&local_a0,">");
      checkForError(bVar3,line,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    bVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
            ::contains(&this->m_types,(key_type *)__lhs);
    iVar1 = *(int *)&p_Var6[9]._M_parent;
    std::operator+(&local_a0,"command uses unknown return type <",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
    std::operator+(&local_80,&local_a0,">");
    checkForError(bVar3,iVar1,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void VulkanHppGenerator::checkCommandCorrectness() const
{
  // prepare command checks by gathering all result codes (including aliases and not supported ones!) into one set of resultCodes
  std::set<std::string> resultCodes = gatherResultCodes();

  // command checks
  for ( auto const & command : m_commands )
  {
    // check that a command is referenced somewhere
    // I think, it's not forbidden to not reference a function, but it would probably be not intended?
    checkForError( !command.second.requiredBy.empty(), command.second.xmlLine, "command <" + command.first + "> not required in any feature or extension" );

    // check for unknown error or succes codes
    for ( auto const & ec : command.second.errorCodes )
    {
      checkForError( resultCodes.contains( ec ), command.second.xmlLine, "command uses unknown error code <" + ec + ">" );
    }
    for ( auto const & sc : command.second.successCodes )
    {
      checkForError( resultCodes.contains( sc ), command.second.xmlLine, "command uses unknown success code <" + sc + ">" );
    }

    // check that functions returning a VkResult specify successcodes
    if ( ( command.second.returnType == "VkResult" ) && command.second.successCodes.empty() )
    {
      // emit an error if this function is required in at least one supported feature or extension
      // disabled or not supported features/extensions are still listed in requiredBy, but not in m_features/m_extensions
      bool functionUsed = false;
      for ( auto const & require : command.second.requiredBy )
      {
        functionUsed |= isSupportedFeature( require ) || isSupportedExtension( require );
      }
      if ( functionUsed )
      {
        checkForError( false, command.second.xmlLine, "missing successcodes on command <" + command.first + "> returning VkResult!" );
      }
    }

    // check that all parameter types as well as the return type are known types
    for ( auto const & p : command.second.params )
    {
      checkForError( m_types.contains( p.type.type ), p.xmlLine, "comand uses parameter of unknown type <" + p.type.type + ">" );
    }
    checkForError(
      m_types.contains( command.second.returnType ), command.second.xmlLine, "command uses unknown return type <" + command.second.returnType + ">" );
  }
}